

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmConstant *
GetConstantArrayValue
          (ExpressionContext *ctx,SynBase *source,TypeArray *typeArray,VmInstruction *instInit)

{
  TypeBase *node;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  VmValue **ppVVar4;
  VmInstruction *instInit_00;
  TypeArray *typeArray_00;
  VmConstant *pVVar5;
  float fValue;
  VmConstant *element;
  VmConstant *elemConst;
  VmInstruction *elementInst;
  VmValue *elementValue;
  uint i;
  char *value;
  uint size;
  TypeBase *elementType;
  VmInstruction *instInit_local;
  TypeArray *typeArray_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  char *value_00;
  
  if (typeArray == (TypeArray *)0x0) {
    __assert_fail("typeArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xc62,
                  "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                 );
  }
  node = typeArray->subType;
  uVar1 = (typeArray->super_TypeBase).size;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
  value_00 = (char *)CONCAT44(extraout_var,iVar2);
  memset(value_00,0,uVar1 & 0xffffffff);
  elementValue._4_4_ = 0;
  do {
    uVar3 = SmallArray<VmValue_*,_4U>::size(&instInit->arguments);
    if (uVar3 <= elementValue._4_4_) {
      pVVar5 = CreateConstantStruct
                         (ctx->allocator,source,value_00,(int)uVar1,&typeArray->super_TypeBase);
      return pVVar5;
    }
    ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&instInit->arguments,elementValue._4_4_);
    elementInst = (VmInstruction *)*ppVVar4;
    instInit_00 = getType<VmInstruction>((VmValue *)elementInst);
    if (instInit_00 == (VmInstruction *)0x0) {
LAB_00352bed:
      pVVar5 = getType<VmConstant>(&elementInst->super_VmValue);
      if ((pVVar5->super_VmValue).type.type == VM_TYPE_INT) {
        if (node->size != (ulong)(pVVar5->super_VmValue).type.size) {
          __assert_fail("elementType->size == element->type.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0xc83,
                        "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                       );
        }
        *(int *)(value_00 + (ulong)elementValue._4_4_ * 4) = pVVar5->iValue;
      }
      else if (((pVVar5->super_VmValue).type.type == VM_TYPE_DOUBLE) && (node == ctx->typeDouble)) {
        *(double *)(value_00 + (ulong)elementValue._4_4_ * 8) = pVVar5->dValue;
      }
      else if (((pVVar5->super_VmValue).type.type == VM_TYPE_DOUBLE) && (node == ctx->typeFloat)) {
        *(float *)(value_00 + (ulong)elementValue._4_4_ * 4) = (float)pVVar5->dValue;
      }
      else if ((pVVar5->super_VmValue).type.type == VM_TYPE_LONG) {
        if (node->size != (ulong)(pVVar5->super_VmValue).type.size) {
          __assert_fail("elementType->size == element->type.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0xc91,
                        "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                       );
        }
        *(longlong *)(value_00 + (ulong)elementValue._4_4_ * 8) = pVVar5->lValue;
      }
      else {
        if (((pVVar5->super_VmValue).type.type != VM_TYPE_STRUCT) || (pVVar5->sValue == (char *)0x0)
           ) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0xc9b,
                        "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                       );
        }
        if (node->size != (ulong)(pVVar5->super_VmValue).type.size) {
          __assert_fail("elementType->size == element->type.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0xc96,
                        "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                       );
        }
        memcpy(value_00 + elementValue._4_4_ * (pVVar5->super_VmValue).type.size,pVVar5->sValue,
               (ulong)(pVVar5->super_VmValue).type.size);
      }
    }
    else {
      if (instInit_00->cmd == VM_INST_DOUBLE_TO_FLOAT) {
        ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&instInit_00->arguments,0);
        elementInst = (VmInstruction *)*ppVVar4;
        goto LAB_00352bed;
      }
      if (instInit_00->cmd != VM_INST_ARRAY) goto LAB_00352bed;
      typeArray_00 = getType<TypeArray>(node);
      pVVar5 = GetConstantArrayValue(ctx,(SynBase *)0x0,typeArray_00,instInit_00);
      if (node->size != (ulong)(pVVar5->super_VmValue).type.size) {
        __assert_fail("elementType->size == elemConst->type.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xc79,
                      "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                     );
      }
      memcpy(value_00 + (ulong)elementValue._4_4_ * node->size,pVVar5->sValue,
             node->size & 0xffffffff);
    }
    elementValue._4_4_ = elementValue._4_4_ + 1;
  } while( true );
}

Assistant:

VmConstant* GetConstantArrayValue(ExpressionContext &ctx, SynBase *source, TypeArray *typeArray, VmInstruction *instInit)
{
	assert(typeArray);

	TypeBase *elementType = typeArray->subType;

	unsigned size = unsigned(typeArray->size);

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	for(unsigned i = 0; i < instInit->arguments.size(); i++)
	{
		VmValue *elementValue = instInit->arguments[i];

		if(VmInstruction *elementInst = getType<VmInstruction>(elementValue))
		{
			if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
			{
				elementValue = elementInst->arguments[0];
			}
			else if(elementInst->cmd == VM_INST_ARRAY)
			{
				VmConstant *elemConst = GetConstantArrayValue(ctx, NULL, getType<TypeArray>(elementType), elementInst);

				assert(elementType->size == elemConst->type.size);
				memcpy(value + i * elementType->size, elemConst->sValue, unsigned(elementType->size));
				continue;
			}
		}

		VmConstant *element = getType<VmConstant>(elementValue);

		if(element->type.type == VM_TYPE_INT)
		{
			assert(elementType->size == element->type.size);
			memcpy(value + i * sizeof(int), &element->iValue, sizeof(int));
		}
		else if(element->type.type == VM_TYPE_DOUBLE && elementType == ctx.typeDouble)
		{
			memcpy(value + i * sizeof(double), &element->dValue, sizeof(double));
		}
		else if(element->type.type == VM_TYPE_DOUBLE && elementType == ctx.typeFloat)
		{
			float fValue = float(element->dValue);
			memcpy(value + i * sizeof(float), &fValue, sizeof(float));
		}
		else if(element->type.type == VM_TYPE_LONG)
		{
			assert(elementType->size == element->type.size);
			memcpy(value + i * sizeof(long long), &element->lValue, sizeof(long long));
		}
		else if(element->type.type == VM_TYPE_STRUCT && element->sValue)
		{
			assert(elementType->size == element->type.size);
			memcpy(value + i * element->type.size, element->sValue, element->type.size);
		}
		else
		{
			assert(!"unknown type");
		}
	}

	return CreateConstantStruct(ctx.allocator, source, value, size, typeArray);
}